

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrLib.c
# Opt level: O0

void Rwr_MarkUsed_rec(Rwr_Man_t *p,Rwr_Node_t *pNode)

{
  Rwr_Node_t *pRVar1;
  Rwr_Node_t *pNode_local;
  Rwr_Man_t *p_local;
  
  if (((*(uint *)&pNode->field_0xe >> 0x1e & 1) == 0) && (pNode->TravId != p->nTravIds)) {
    pNode->TravId = p->nTravIds;
    *(uint *)&pNode->field_0xe = *(uint *)&pNode->field_0xe & 0xbfffffff | 0x40000000;
    pRVar1 = Rwr_Regular(pNode->p0);
    Rwr_MarkUsed_rec(p,pRVar1);
    pRVar1 = Rwr_Regular(pNode->p1);
    Rwr_MarkUsed_rec(p,pRVar1);
  }
  return;
}

Assistant:

void Rwr_MarkUsed_rec( Rwr_Man_t * p, Rwr_Node_t * pNode )
{
    if ( pNode->fUsed || pNode->TravId == p->nTravIds )
        return;
    pNode->TravId = p->nTravIds;
    pNode->fUsed = 1;
    Rwr_MarkUsed_rec( p, Rwr_Regular(pNode->p0) );
    Rwr_MarkUsed_rec( p, Rwr_Regular(pNode->p1) );
}